

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O0

string * __thiscall Color::bg_abi_cxx11_(string *__return_storage_ptr__,Color *this)

{
  ostream *this_00;
  allocator<char> local_1b9;
  uint local_1b8;
  uint i;
  stringstream local_1a8 [8];
  stringstream s;
  ostream local_198 [380];
  uint local_1c;
  Color *pCStack_18;
  int index;
  Color *this_local;
  
  local_1c = (this->_value & 0xff00) >> 8;
  pCStack_18 = this;
  this_local = (Color *)__return_storage_ptr__;
  if ((this->_value & 0x200000) == 0) {
    for (local_1b8 = 0; local_1b8 < 9; local_1b8 = local_1b8 + 1) {
      if (allColors[local_1b8].index == local_1c) {
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,(string *)&allColors[local_1b8].english_name);
        return __return_storage_ptr__;
      }
    }
  }
  else if ((this->_value & 0x100000) != 0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    this_00 = std::operator<<(local_198,"color");
    std::ostream::operator<<(this_00,(uint)*(byte *)((long)&this->_value + 1));
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_1a8);
    return __return_storage_ptr__;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_1b9)
  ;
  std::allocator<char>::~allocator(&local_1b9);
  return __return_storage_ptr__;
}

Assistant:

std::string Color::bg () const
{
#ifdef FEATURE_COLOR
  int index = (_value & _COLOR_BG) >> 8;

  if (_value & _COLOR_256)
  {
    if (_value & _COLOR_HASBG)
    {
      std::stringstream s;
      s << "color" << ((_value & _COLOR_BG) >> 8);
      return s.str ();
    }
  }
  else
  {
    for (unsigned int i = 0; i < NUM_COLORS; ++i)
      if (allColors[i].index == index)
        return allColors[i].english_name;
  }
#endif

  return "";
}